

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::weight(vector<float,_std::allocator<float>_> *__return_storage_ptr__,MXNetNode *this,
                 int i,int init_len)

{
  pointer piVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  pointer pMVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  value_type_conflict2 local_48;
  value_type_conflict2 local_44;
  size_type local_40;
  string *local_38;
  
  if (((-1 < i) &&
      (piVar1 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
      i < (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) &&
     (pMVar4 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
               super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(this->params->
                             super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar4) >> 3) * -0x45d1745d))
  {
    local_38 = &(this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
                super__Vector_impl_data._M_start[piVar1[(uint)i]].name;
    local_40 = (size_type)init_len;
    lVar6 = 0x20;
    lVar3 = 0;
    do {
      __n = *(size_t *)((long)pMVar4 + lVar6 + -0x18);
      bVar7 = true;
      if (__n == local_38->_M_string_length) {
        if (__n == 0) {
          bVar7 = false;
        }
        else {
          iVar2 = bcmp(*(void **)((long)pMVar4 + lVar6 + -0x20),(local_38->_M_dataplus)._M_p,__n);
          bVar7 = iVar2 != 0;
        }
      }
      if (!bVar7) {
        if (*(long *)((long)&(pMVar4->name)._M_dataplus._M_p + lVar6) !=
            *(long *)((long)&(pMVar4->name)._M_string_length + lVar6)) {
          std::vector<float,_std::allocator<float>_>::vector
                    (__return_storage_ptr__,
                     (vector<float,_std::allocator<float>_> *)
                     ((long)&(pMVar4->name)._M_dataplus._M_p + lVar6));
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (init_len == 0) {
          return __return_storage_ptr__;
        }
        if (*(long *)((long)&(pMVar4->data).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl + lVar6) == 0) {
          return __return_storage_ptr__;
        }
        pcVar5 = (pMVar4->name).field_2._M_local_buf + lVar6 + 8;
        iVar2 = std::__cxx11::string::compare(pcVar5);
        if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare(pcVar5), iVar2 != 0)) &&
           (iVar2 = std::__cxx11::string::compare(pcVar5), iVar2 != 0)) {
          iVar2 = std::__cxx11::string::compare(pcVar5);
          if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare(pcVar5), iVar2 != 0)) &&
             (iVar2 = std::__cxx11::string::compare(pcVar5), iVar2 != 0)) {
            return __return_storage_ptr__;
          }
          local_48 = 1.0;
          std::vector<float,_std::allocator<float>_>::resize
                    (__return_storage_ptr__,local_40,&local_48);
          return __return_storage_ptr__;
        }
        local_44 = 0.0;
        std::vector<float,_std::allocator<float>_>::resize
                  (__return_storage_ptr__,local_40,&local_44);
        return __return_storage_ptr__;
      }
      lVar3 = lVar3 + 1;
      pMVar4 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x58;
    } while (lVar3 < (int)((ulong)((long)(this->params->
                                         super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4)
                          >> 3) * -0x45d1745d);
  }
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> MXNetNode::weight(int i, int init_len) const
{
    if (i < 0 || i >= (int)weights.size())
        return std::vector<float>();

    const std::string& node_name = (*nodes)[weights[i]].name;

    for (int j = 0; j < (int)(*params).size(); j++)
    {
        const MXNetParam& p = (*params)[j];
        if (p.name != node_name)
            continue;

        if (!p.data.empty())
            return p.data;

        std::vector<float> data;

        if (!p.init.empty() && init_len != 0)
        {
            if (p.init == "[\\$zero\\$, {}]" || p.init == "[\\\"zero\\\", {}]" || p.init == "zeros")
            {
                data.resize(init_len, 0.f);
            }
            else if (p.init == "[\\$one\\$, {}]" || p.init == "[\\\"one\\\", {}]" || p.init == "ones")
            {
                data.resize(init_len, 1.f);
            }
        }

        return data;
    }

    return std::vector<float>();
}